

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMModel.hpp
# Opt level: O1

void __thiscall cppjieba::HMMModel::LoadModel(HMMModel *this,string *filePath)

{
  undefined1 *puVar1;
  double dVar2;
  HMMModel *this_00;
  char cVar3;
  bool bVar4;
  ostream *poVar5;
  pointer pbVar6;
  double (*padVar7) [4];
  long lVar8;
  long lVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tmp;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tmp2;
  ifstream ifile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_428;
  string local_408;
  long local_3e8;
  HMMModel *local_3e0;
  undefined1 *local_3d8 [2];
  undefined1 local_3c8 [368];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258;
  ifstream local_238 [520];
  
  std::ifstream::ifstream(local_238,(filePath->_M_dataplus)._M_p,_S_in);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    limonp::Logger::Logger
              ((Logger *)local_3d8,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/HMMModel.hpp"
               ,0x24);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3d8,"exp: [ifile.is_open()",0x15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d8,"] false. ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d8,"open ",5);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_3d8,(filePath->_M_dataplus)._M_p,filePath->_M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," failed",7);
    limonp::Logger::~Logger((Logger *)local_3d8);
  }
  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  local_408._M_string_length = 0;
  local_408.field_2._M_local_buf[0] = '\0';
  local_428.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_428.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_428.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar4 = GetLine(this,local_238,&local_408);
  if (!bVar4) {
    limonp::Logger::Logger
              ((Logger *)local_3d8,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/HMMModel.hpp"
               ,0x29);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3d8,"exp: [GetLine(ifile, line)",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d8,"] false. ",9);
    limonp::Logger::~Logger((Logger *)local_3d8);
  }
  puVar1 = &((Logger *)local_3d8)->field_0x10;
  local_3d8[0] = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8," ","");
  limonp::Split(&local_408,&local_428,(string *)local_3d8,0xffffffffffffffff);
  if (local_3d8[0] != puVar1) {
    operator_delete(local_3d8[0]);
  }
  if ((long)local_428.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_428.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x80) {
    limonp::Logger::Logger
              ((Logger *)local_3d8,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/HMMModel.hpp"
               ,0x2b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3d8,"exp: [tmp.size() == STATUS_SUM",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d8,"] false. ",9);
    limonp::Logger::~Logger((Logger *)local_3d8);
  }
  if ((long)local_428.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_428.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0) {
    lVar8 = (long)local_428.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_428.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    lVar9 = 0;
    pbVar6 = local_428.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      dVar2 = atof((pbVar6->_M_dataplus)._M_p);
      this->startProb[lVar9] = dVar2;
      lVar9 = lVar9 + 1;
      pbVar6 = pbVar6 + 1;
    } while (lVar8 + (ulong)(lVar8 == 0) != lVar9);
  }
  padVar7 = this->transProb;
  local_3e8 = 0;
  local_3e0 = this;
  do {
    bVar4 = GetLine(local_3e0,local_238,&local_408);
    if (!bVar4) {
      limonp::Logger::Logger
                ((Logger *)local_3d8,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/HMMModel.hpp"
                 ,0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3d8,"exp: [GetLine(ifile, line)",0x1a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d8,"] false. ",9);
      limonp::Logger::~Logger((Logger *)local_3d8);
    }
    local_3d8[0] = puVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8," ","");
    limonp::Split(&local_408,&local_428,(string *)local_3d8,0xffffffffffffffff);
    if (local_3d8[0] != puVar1) {
      operator_delete(local_3d8[0]);
    }
    if ((long)local_428.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_428.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x80) {
      limonp::Logger::Logger
                ((Logger *)local_3d8,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/HMMModel.hpp"
                 ,0x34);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3d8,"exp: [tmp.size() == STATUS_SUM",0x1e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d8,"] false. ",9);
      limonp::Logger::~Logger((Logger *)local_3d8);
    }
    pbVar6 = local_428.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      dVar2 = atof(*(char **)((long)&(pbVar6->_M_dataplus)._M_p + lVar8 * 4));
      this_00 = local_3e0;
      *(double *)((long)*padVar7 + lVar8) = dVar2;
      lVar8 = lVar8 + 8;
    } while (lVar8 != 0x20);
    local_3e8 = local_3e8 + 1;
    padVar7 = padVar7 + 1;
  } while (local_3e8 != 4);
  bVar4 = GetLine(local_3e0,local_238,&local_408);
  if (!bVar4) {
    limonp::Logger::Logger
              ((Logger *)local_3d8,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/HMMModel.hpp"
               ,0x3b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3d8,"exp: [GetLine(ifile, line)",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d8,"] false. ",9);
    limonp::Logger::~Logger((Logger *)local_3d8);
  }
  bVar4 = LoadEmitProb(this_00,&local_408,&this_00->emitProbB);
  if (!bVar4) {
    limonp::Logger::Logger
              ((Logger *)local_3d8,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/HMMModel.hpp"
               ,0x3c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3d8,"exp: [LoadEmitProb(line, emitProbB)",0x23);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d8,"] false. ",9);
    limonp::Logger::~Logger((Logger *)local_3d8);
  }
  bVar4 = GetLine(this_00,local_238,&local_408);
  if (!bVar4) {
    limonp::Logger::Logger
              ((Logger *)local_3d8,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/HMMModel.hpp"
               ,0x3f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3d8,"exp: [GetLine(ifile, line)",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d8,"] false. ",9);
    limonp::Logger::~Logger((Logger *)local_3d8);
  }
  bVar4 = LoadEmitProb(this_00,&local_408,&this_00->emitProbE);
  if (!bVar4) {
    limonp::Logger::Logger
              ((Logger *)local_3d8,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/HMMModel.hpp"
               ,0x40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3d8,"exp: [LoadEmitProb(line, emitProbE)",0x23);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d8,"] false. ",9);
    limonp::Logger::~Logger((Logger *)local_3d8);
  }
  bVar4 = GetLine(this_00,local_238,&local_408);
  if (!bVar4) {
    limonp::Logger::Logger
              ((Logger *)local_3d8,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/HMMModel.hpp"
               ,0x43);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3d8,"exp: [GetLine(ifile, line)",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d8,"] false. ",9);
    limonp::Logger::~Logger((Logger *)local_3d8);
  }
  bVar4 = LoadEmitProb(this_00,&local_408,&this_00->emitProbM);
  if (!bVar4) {
    limonp::Logger::Logger
              ((Logger *)local_3d8,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/HMMModel.hpp"
               ,0x44);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3d8,"exp: [LoadEmitProb(line, emitProbM)",0x23);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d8,"] false. ",9);
    limonp::Logger::~Logger((Logger *)local_3d8);
  }
  bVar4 = GetLine(this_00,local_238,&local_408);
  if (!bVar4) {
    limonp::Logger::Logger
              ((Logger *)local_3d8,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/HMMModel.hpp"
               ,0x47);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3d8,"exp: [GetLine(ifile, line)",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d8,"] false. ",9);
    limonp::Logger::~Logger((Logger *)local_3d8);
  }
  bVar4 = LoadEmitProb(this_00,&local_408,&this_00->emitProbS);
  if (!bVar4) {
    limonp::Logger::Logger
              ((Logger *)local_3d8,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/HMMModel.hpp"
               ,0x48);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3d8,"exp: [LoadEmitProb(line, emitProbS)",0x23);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d8,"] false. ",9);
    limonp::Logger::~Logger((Logger *)local_3d8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_258);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_428);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p);
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void LoadModel(const string& filePath) {
    ifstream ifile(filePath.c_str());
    XCHECK(ifile.is_open()) << "open " << filePath << " failed";
    string line;
    vector<string> tmp;
    vector<string> tmp2;
    //Load startProb
    XCHECK(GetLine(ifile, line));
    Split(line, tmp, " ");
    XCHECK(tmp.size() == STATUS_SUM);
    for (size_t j = 0; j< tmp.size(); j++) {
      startProb[j] = atof(tmp[j].c_str());
    }

    //Load transProb
    for (size_t i = 0; i < STATUS_SUM; i++) {
      XCHECK(GetLine(ifile, line));
      Split(line, tmp, " ");
      XCHECK(tmp.size() == STATUS_SUM);
      for (size_t j =0; j < STATUS_SUM; j++) {
        transProb[i][j] = atof(tmp[j].c_str());
      }
    }

    //Load emitProbB
    XCHECK(GetLine(ifile, line));
    XCHECK(LoadEmitProb(line, emitProbB));

    //Load emitProbE
    XCHECK(GetLine(ifile, line));
    XCHECK(LoadEmitProb(line, emitProbE));

    //Load emitProbM
    XCHECK(GetLine(ifile, line));
    XCHECK(LoadEmitProb(line, emitProbM));

    //Load emitProbS
    XCHECK(GetLine(ifile, line));
    XCHECK(LoadEmitProb(line, emitProbS));
  }